

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

void __thiscall
booster::locale::localization_backend_manager::impl::add_backend
          (impl *this,string *name,
          unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
          *backend_ptr)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
  *in_RDI;
  uint i_1;
  uint i;
  shared_ptr<booster::locale::localization_backend> sptr;
  value_type *in_stack_ffffffffffffff28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  uint local_6c;
  uint local_68;
  
  std::shared_ptr<booster::locale::localization_backend>::
  shared_ptr<booster::locale::localization_backend,std::default_delete<booster::locale::localization_backend>,void>
            ((shared_ptr<booster::locale::localization_backend> *)in_stack_ffffffffffffff30,
             (unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
              *)in_stack_ffffffffffffff28);
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
          ::empty(in_stack_ffffffffffffff40);
  if (bVar1) {
    std::
    make_pair<std::__cxx11::string_const&,std::shared_ptr<booster::locale::localization_backend>&>
              (in_stack_ffffffffffffff38,
               (shared_ptr<booster::locale::localization_backend> *)in_stack_ffffffffffffff30);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::~pair(in_stack_ffffffffffffff30);
    local_68 = 0;
    while( true ) {
      uVar3 = (ulong)local_68;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)((long)&(in_RDI->first).field_2 + 8));
      if (sVar4 <= uVar3) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((long)&(in_RDI->first).field_2 + 8),
                          (ulong)local_68);
      *pvVar5 = 0;
      local_68 = local_68 + 1;
    }
  }
  else {
    local_6c = 0;
    while( true ) {
      __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_6c;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
               ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                       *)in_RDI);
      if (pbVar6 <= __x) break;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                    *)in_RDI,(ulong)local_6c);
      _Var2 = std::operator==(in_RDX,in_stack_ffffffffffffff48);
      if (_Var2) goto LAB_0023b0da;
      local_6c = local_6c + 1;
    }
    std::
    make_pair<std::__cxx11::string_const&,std::shared_ptr<booster::locale::localization_backend>&>
              (__x,(shared_ptr<booster::locale::localization_backend> *)in_RDI);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                 *)in_RDI,in_stack_ffffffffffffff28);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::~pair(in_RDI);
  }
LAB_0023b0da:
  std::shared_ptr<booster::locale::localization_backend>::~shared_ptr
            ((shared_ptr<booster::locale::localization_backend> *)0x23b0e7);
  return;
}

Assistant:

void add_backend(std::string const &name,std::unique_ptr<localization_backend> backend_ptr)
            {
                booster::shared_ptr<localization_backend> sptr(std::move(backend_ptr));
                if(all_backends_.empty()) {
                    all_backends_.push_back(std::make_pair(name,sptr));
                    for(unsigned i=0;i<default_backends_.size();i++)
                        default_backends_[i]=0;
                }
                else { 
                    for(unsigned i=0;i<all_backends_.size();i++)
                        if(all_backends_[i].first == name)
                            return;
                    all_backends_.push_back(std::make_pair(name,sptr));
                }
            }